

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yoml-parser.h
# Opt level: O1

int yoml__resolve_merge(yoml_t **target,yaml_parser_t *parser,yoml_parse_args_t *parse_args)

{
  size_t sVar1;
  long *plVar2;
  yoml_type_t yVar3;
  yoml_t *node;
  yoml_t *node_00;
  int *piVar4;
  int *piVar5;
  int iVar6;
  yoml_t *pyVar7;
  long lVar8;
  char *pcVar9;
  long lVar10;
  undefined8 *puVar11;
  size_t sVar12;
  long lVar13;
  size_t sVar14;
  
  yVar3 = (*target)->type;
  if (yVar3 == YOML_TYPE_SEQUENCE) {
    pyVar7 = *target;
    if ((pyVar7->data).scalar == (char *)0x0) {
      return 0;
    }
    lVar13 = 0x40;
    pcVar9 = (char *)0x0;
    do {
      iVar6 = yoml__resolve_merge((yoml_t **)((long)&pyVar7->type + lVar13),parser,parse_args);
      if (iVar6 != 0) {
        return -1;
      }
      pcVar9 = pcVar9 + 1;
      pyVar7 = *target;
      lVar13 = lVar13 + 8;
    } while (pcVar9 != (pyVar7->data).scalar);
  }
  else {
    if (yVar3 != YOML_TYPE_MAPPING) {
      if (yVar3 == YOML__TYPE_UNRESOLVED_ALIAS) {
        __assert_fail("!\"unreachable\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/yoml/yoml-parser.h"
                      ,0x10c,
                      "int yoml__resolve_merge(yoml_t **, yaml_parser_t *, yoml_parse_args_t *)");
      }
      return 0;
    }
    sVar14 = ((*target)->data).sequence.size;
    if (sVar14 == 0) {
      return 0;
    }
    do {
      sVar1 = sVar14 - 1;
      lVar13 = sVar14 * 0x10;
      iVar6 = yoml__resolve_merge((yoml_t **)(&(*target)->_refcnt + sVar14 * 2),parser,parse_args);
      if (iVar6 != 0) {
        return -1;
      }
      iVar6 = yoml__resolve_merge((yoml_t **)((long)&(*target)->data + lVar13),parser,parse_args);
      if (iVar6 != 0) {
        return -1;
      }
      pyVar7 = *target;
      node = (yoml_t *)(&pyVar7->_refcnt)[sVar14 * 2];
      if ((node->type == YOML_TYPE_SCALAR) && (iVar6 = strcmp((node->data).scalar,"<<"), iVar6 == 0)
         ) {
        node_00 = *(yoml_t **)((long)&pyVar7->data + lVar13);
        memmove(&pyVar7->_refcnt + sVar14 * 2,(void *)((long)&pyVar7->data + lVar13 + 8),
                ((long)(pyVar7->data).scalar - sVar14) * 0x10);
        ((*target)->data).scalar = (char *)(((*target)->data).sequence.size - 1);
        if (node_00->type == YOML_TYPE_MAPPING) {
          if ((node_00->data).scalar != (char *)0x0) {
            pcVar9 = (char *)0x0;
            sVar14 = sVar1;
            do {
              piVar4 = *(int **)((long)&node_00->data + (long)pcVar9 * 0x10 + 8);
              lVar13 = *(long *)((long)&node_00->data + (long)pcVar9 * 0x10 + 0x10);
              if (*piVar4 == 0) {
                sVar12 = ((*target)->data).sequence.size;
                if (sVar14 != sVar12) {
                  puVar11 = (undefined8 *)((long)&(*target)->data + sVar14 * 0x10 + 8);
                  do {
                    if ((*(int *)*puVar11 == 0) &&
                       (iVar6 = strcmp(*(char **)((int *)*puVar11 + 0xe),*(char **)(piVar4 + 0xe)),
                       iVar6 == 0)) goto LAB_0019453d;
                    sVar12 = sVar12 - 1;
                    puVar11 = puVar11 + 2;
                  } while (sVar14 != sVar12);
                }
              }
              pyVar7 = (yoml_t *)realloc(*target,((*target)->data).sequence.size * 0x10 + 0x50);
              *target = pyVar7;
              lVar10 = sVar14 * 0x10;
              memmove(&pyVar7[1].type + sVar14 * 4,(void *)((long)&pyVar7->data + lVar10 + 8),
                      ((long)(pyVar7->data).scalar - sVar14) * 0x10);
              *(int **)((long)&pyVar7->data + lVar10 + 8) = piVar4;
              *(long *)(piVar4 + 0xc) = *(long *)(piVar4 + 0xc) + 1;
              *(long *)((long)&pyVar7->data + lVar10 + 0x10) = lVar13;
              plVar2 = (long *)(lVar13 + 0x30);
              *plVar2 = *plVar2 + 1;
              (pyVar7->data).scalar = (char *)((pyVar7->data).sequence.size + 1);
              sVar14 = sVar14 + 1;
LAB_0019453d:
              pcVar9 = pcVar9 + 1;
            } while (pcVar9 != (node_00->data).scalar);
          }
        }
        else {
          if (node_00->type != YOML_TYPE_SEQUENCE) {
LAB_001945c3:
            if (parser == (yaml_parser_t *)0x0) {
              return -1;
            }
            parser->problem = "value of the merge key MUST be a mapping or a sequence of mappings";
            (parser->problem_mark).line = node->line;
            (parser->problem_mark).column = node->column;
            return -1;
          }
          if ((node_00->data).scalar != (char *)0x0) {
            pcVar9 = (char *)0x0;
            do {
              piVar4 = *(int **)((long)&node_00->data + (long)pcVar9 * 8 + 8);
              if (*piVar4 != 2) goto LAB_001945c3;
              if (*(long *)(piVar4 + 0xe) != 0) {
                lVar13 = 0;
                sVar14 = sVar1;
                do {
                  piVar5 = *(int **)(piVar4 + lVar13 * 4 + 0x10);
                  lVar10 = *(long *)(piVar4 + lVar13 * 4 + 0x12);
                  if (*piVar5 == 0) {
                    sVar12 = ((*target)->data).sequence.size;
                    if (sVar14 != sVar12) {
                      puVar11 = (undefined8 *)((long)&(*target)->data + sVar14 * 0x10 + 8);
                      do {
                        if ((*(int *)*puVar11 == 0) &&
                           (iVar6 = strcmp(*(char **)((int *)*puVar11 + 0xe),
                                           *(char **)(piVar5 + 0xe)), iVar6 == 0))
                        goto LAB_00194421;
                        sVar12 = sVar12 - 1;
                        puVar11 = puVar11 + 2;
                      } while (sVar14 != sVar12);
                    }
                  }
                  pyVar7 = (yoml_t *)realloc(*target,((*target)->data).sequence.size * 0x10 + 0x50);
                  *target = pyVar7;
                  lVar8 = sVar14 * 0x10;
                  memmove(&pyVar7[1].type + sVar14 * 4,(void *)((long)&pyVar7->data + lVar8 + 8),
                          ((long)(pyVar7->data).scalar - sVar14) * 0x10);
                  *(int **)((long)&pyVar7->data + lVar8 + 8) = piVar5;
                  *(long *)(piVar5 + 0xc) = *(long *)(piVar5 + 0xc) + 1;
                  *(long *)((long)&pyVar7->data + lVar8 + 0x10) = lVar10;
                  plVar2 = (long *)(lVar10 + 0x30);
                  *plVar2 = *plVar2 + 1;
                  (pyVar7->data).scalar = (char *)((pyVar7->data).sequence.size + 1);
                  sVar14 = sVar14 + 1;
LAB_00194421:
                  lVar13 = lVar13 + 1;
                } while (lVar13 != *(long *)(piVar4 + 0xe));
              }
              pcVar9 = pcVar9 + 1;
            } while (pcVar9 != (node_00->data).scalar);
          }
        }
        yoml_free(node,parse_args->mem_set);
        yoml_free(node_00,parse_args->mem_set);
      }
      sVar14 = sVar1;
    } while (sVar1 != 0);
  }
  return 0;
}

Assistant:

static inline int yoml__resolve_merge(yoml_t **target, yaml_parser_t *parser, yoml_parse_args_t *parse_args)
{
    size_t i, j;

    switch ((*target)->type) {
    case YOML_TYPE_SCALAR:
        break;
    case YOML_TYPE_SEQUENCE:
        for (i = 0; i != (*target)->data.sequence.size; ++i) {
            if (yoml__resolve_merge((*target)->data.sequence.elements + i, parser, parse_args) != 0)
                return -1;
        }
        break;
    case YOML_TYPE_MAPPING:
        if ((*target)->data.mapping.size != 0) {
            i = (*target)->data.mapping.size;
            do {
                --i;
                if (yoml__resolve_merge(&(*target)->data.mapping.elements[i].key, parser, parse_args) != 0)
                    return -1;
                if (yoml__resolve_merge(&(*target)->data.mapping.elements[i].value, parser, parse_args) != 0)
                    return -1;
                if ((*target)->data.mapping.elements[i].key->type == YOML_TYPE_SCALAR &&
                    strcmp((*target)->data.mapping.elements[i].key->data.scalar, "<<") == 0) {
                    /* erase the slot (as well as preserving the values) */
                    yoml_mapping_element_t src = (*target)->data.mapping.elements[i];
                    memmove((*target)->data.mapping.elements + i, (*target)->data.mapping.elements + i + 1,
                            ((*target)->data.mapping.size - i - 1) * sizeof((*target)->data.mapping.elements[0]));
                    --(*target)->data.mapping.size;
                    /* merge */
                    if (src.value->type == YOML_TYPE_SEQUENCE) {
                        for (j = 0; j != src.value->data.sequence.size; ++j)
                            if (yoml__merge(target, i, src.value->data.sequence.elements[j]) != 0) {
                            MergeError:
                                if (parser != NULL) {
                                    parser->problem = "value of the merge key MUST be a mapping or a sequence of mappings";
                                    parser->problem_mark.line = src.key->line;
                                    parser->problem_mark.column = src.key->column;
                                }
                                return -1;
                            }
                    } else {
                        if (yoml__merge(target, i, src.value) != 0)
                            goto MergeError;
                    }
                    /* cleanup */
                    yoml_free(src.key, parse_args->mem_set);
                    yoml_free(src.value, parse_args->mem_set);
                }
            } while (i != 0);
        }
        break;
    case YOML__TYPE_UNRESOLVED_ALIAS:
        assert(!"unreachable");
        break;
    }

    return 0;
}